

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O1

int al_ustr_find_chr(ALLEGRO_USTR *us,int start_pos,int32_t c)

{
  int iVar1;
  size_t sVar2;
  char encc [4];
  _al_tagbstring enctb;
  uchar local_2c [4];
  _al_tagbstring local_28;
  
  if (c < 0x80) {
    iVar1 = _al_bstrchrp(us,c,start_pos);
    return iVar1;
  }
  sVar2 = al_utf8_encode((char *)local_2c,c);
  if (sVar2 == 0) {
    al_set_errno(0x16);
    iVar1 = -1;
  }
  else {
    local_28.slen = (int)sVar2;
    local_28.mlen = -1;
    local_28.data = local_2c;
    iVar1 = _al_binstr(us,start_pos,&local_28);
  }
  return iVar1;
}

Assistant:

int al_ustr_find_chr(const ALLEGRO_USTR *us, int start_pos, int32_t c)
{
   char encc[4];
   size_t sizec;
   struct _al_tagbstring enctb;
   int rc;

   /* Fast path for ASCII characters. */
   if (c < 128) {
      rc = _al_bstrchrp(us, c, start_pos);
      return (rc == _AL_BSTR_ERR) ? -1 : rc;
   }

   /* Non-ASCII.  We can simply encode the character into a string and search
    * for that.
    */

   sizec = al_utf8_encode(encc, c);
   if (!sizec) {
      al_set_errno(EINVAL);
      return -1; /* error */
   }

   _al_blk2tbstr(enctb, encc, sizec);
   rc = _al_binstr(us, start_pos, &enctb);
   return (rc == _AL_BSTR_ERR) ? -1 : rc;
}